

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_dxt_hc.cpp
# Opt level: O3

void __thiscall
crnlib::dxt_hc::create_color_selector_codebook_task(dxt_hc *this,uint64 data,void *pData_ptr)

{
  color_quad_u8 *pcVar1;
  int *piVar2;
  bool bVar3;
  bool bVar4;
  byte bVar5;
  byte bVar6;
  ushort uVar7;
  ushort uVar8;
  endpoint_indices_details *peVar9;
  color_cluster *pcVar10;
  color_quad_u8 (*pacVar11) [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  int iVar14;
  int iVar15;
  int iVar16;
  ulong uVar17;
  int *piVar18;
  uint p;
  int iVar19;
  ulong uVar20;
  ulong uVar21;
  ulong uVar22;
  int iVar23;
  uint s;
  uint uVar24;
  long lVar25;
  uint s_1;
  uint uVar26;
  ulong uVar27;
  long lVar28;
  int iVar29;
  uint E4 [8] [16];
  uint E8 [4] [256];
  int local_1338 [192];
  int local_1038 [256];
  int aiStack_c38 [256];
  int aiStack_838 [256];
  int aiStack_438 [258];
  
  uVar27 = CONCAT44(0,this->m_pTask_pool->m_num_threads + 1);
  uVar22 = (ulong)(this->m_num_blocks >> (this->m_has_subblocks & 0x1fU));
  auVar12._8_8_ = 0;
  auVar12._0_8_ = uVar27;
  auVar13._8_8_ = 0;
  auVar13._0_8_ = uVar22 * data;
  uVar27 = ((data + 1) * uVar22) / uVar27;
  if (SUB164(auVar13 / auVar12,0) < (uint)uVar27) {
    uVar22 = SUB168(auVar13 / auVar12,0) & 0xffffffff;
    do {
      peVar9 = (this->m_endpoint_indices).m_p;
      uVar7 = peVar9[uVar22].field_0.field_0.color;
      pcVar10 = (this->m_color_clusters).m_p;
      bVar3 = this->m_has_subblocks;
      bVar4 = (this->m_params).m_perceptual;
      pacVar11 = this->m_blocks;
      piVar18 = local_1338;
      uVar17 = 0;
      do {
        pcVar1 = pacVar11[uVar22] + uVar17;
        lVar25 = 0;
        do {
          if (bVar3 == false) {
            bVar5 = (pcVar1->field_0).field_0.b;
            iVar23 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar7].color_values[lVar25].field_0.field_0.r;
            iVar29 = (uint)(pcVar1->field_0).field_0.g -
                     (uint)pcVar10[uVar7].color_values[lVar25].field_0.field_0.g;
            bVar6 = pcVar10[uVar7].color_values[lVar25].field_0.field_0.b;
          }
          else {
            uVar8 = peVar9[((uint)(uVar17 >> 3) & 0x1fffffff) + (int)uVar22 * 2].field_0.field_0.
                    color;
            bVar5 = (pcVar1->field_0).field_0.b;
            iVar23 = (uint)(pcVar1->field_0).field_0.r -
                     (uint)pcVar10[uVar8].color_values[lVar25].field_0.field_0.r;
            iVar29 = (uint)(pcVar1->field_0).field_0.g -
                     (uint)pcVar10[uVar8].color_values[lVar25].field_0.field_0.g;
            bVar6 = pcVar10[uVar8].color_values[lVar25].field_0.field_0.b;
          }
          iVar19 = (uint)bVar5 - (uint)bVar6;
          if ((bVar4 & 1U) == 0) {
            iVar23 = iVar19 * iVar19 + iVar29 * iVar29 + iVar23 * iVar23;
          }
          else {
            iVar23 = iVar19 * iVar19 + iVar29 * iVar29 * 0x19 + iVar23 * iVar23 * 8;
          }
          piVar18[lVar25] = iVar23;
          lVar25 = lVar25 + 1;
        } while (lVar25 != 4);
        uVar17 = uVar17 + 1;
        piVar18 = piVar18 + 4;
      } while (uVar17 != 0x10);
      piVar18 = local_1338 + 0x40;
      lVar25 = 0;
      do {
        lVar28 = 0;
        do {
          piVar18[lVar28] =
               *(int *)((long)local_1338 +
                       (ulong)((uint)lVar28 & 0xfffffffc) + (lVar25 * 2 + 1) * 0x10) +
               local_1338[lVar25 * 8 + (ulong)((uint)lVar28 & 3)];
          lVar28 = lVar28 + 1;
        } while (lVar28 != 0x10);
        lVar25 = lVar25 + 1;
        piVar18 = piVar18 + 0x10;
      } while (lVar25 != 8);
      piVar18 = local_1038;
      lVar25 = 0;
      do {
        uVar17 = 0;
        do {
          piVar18[uVar17] =
               local_1338[(lVar25 * 2 + 1) * 0x10 + (uVar17 >> 4 & 0xfffffff) + 0x40] +
               local_1338[lVar25 * 0x20 + (ulong)((uint)uVar17 & 0xf) + 0x40];
          uVar17 = uVar17 + 1;
        } while (uVar17 != 0x100);
        lVar25 = lVar25 + 1;
        piVar18 = piVar18 + 0x100;
      } while (lVar25 != 4);
      uVar17 = (ulong)(this->m_color_selectors).m_size;
      if (uVar17 == 0) {
        uVar20 = 0;
      }
      else {
        uVar21 = 0;
        uVar24 = 0xffffffff;
        uVar20 = 0;
        do {
          uVar26 = (this->m_color_selectors).m_p[uVar21];
          uVar26 = aiStack_c38[uVar26 >> 8 & 0xff] + local_1038[uVar26 & 0xff] +
                   *(int *)((long)aiStack_838 + (ulong)(uVar26 >> 0xe & 0x3fc)) +
                   aiStack_438[uVar26 >> 0x18];
          if (uVar26 < uVar24) {
            uVar20 = uVar21 & 0xffffffff;
            uVar24 = uVar26;
          }
          uVar21 = uVar21 + 1;
        } while (uVar17 != uVar21);
      }
      lVar25 = *pData_ptr + uVar20 * 0x104;
      lVar28 = 0;
      do {
        piVar18 = (int *)(lVar25 + lVar28);
        iVar23 = piVar18[1];
        iVar29 = piVar18[2];
        iVar19 = piVar18[3];
        iVar14 = *(int *)((long)local_1338 + lVar28 + 4);
        iVar15 = *(int *)((long)local_1338 + lVar28 + 8);
        iVar16 = *(int *)((long)local_1338 + lVar28 + 0xc);
        piVar2 = (int *)(lVar25 + lVar28);
        *piVar2 = *piVar18 + *(int *)((long)local_1338 + lVar28);
        piVar2[1] = iVar23 + iVar14;
        piVar2[2] = iVar29 + iVar15;
        piVar2[3] = iVar19 + iVar16;
        lVar28 = lVar28 + 0x10;
      } while (lVar28 != 0x100);
      *(undefined1 *)(*pData_ptr + 0x100 + uVar20 * 0x104) = 1;
      (this->m_selector_indices).m_p[(uint)((int)uVar22 << (this->m_has_subblocks & 0x1fU))].field_0
      .field_0.color = (uint16)uVar20;
      uVar22 = uVar22 + 1;
    } while (uVar22 < (uVar27 & 0xffffffff));
  }
  return;
}

Assistant:

void dxt_hc::create_color_selector_codebook_task(uint64 data, void* pData_ptr) {
  crnlib::vector<color_selector_details>& selector_details = *static_cast<crnlib::vector<color_selector_details>*>(pData_ptr);
  uint num_tasks = m_pTask_pool->get_num_threads() + 1;
  uint E2[16][4];
  uint E4[8][16];
  uint E8[4][256];
  for (uint n = m_has_subblocks ? m_num_blocks >> 1 : m_num_blocks, b = n * data / num_tasks, bEnd = n * (data + 1) / num_tasks; b < bEnd; b++) {
    color_cluster& cluster = m_color_clusters[m_endpoint_indices[b].color];
    color_quad_u8* endpoint_colors = cluster.color_values;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        E2[p][s] = m_has_subblocks ? color::color_distance(m_params.m_perceptual, m_blocks[b][p], m_color_clusters[m_endpoint_indices[b << 1 | p >> 3].color].color_values[s], false) :
          color::color_distance(m_params.m_perceptual, m_blocks[b][p], endpoint_colors[s], false);
    }
    for (uint p = 0; p < 8; p++) {
      for (uint s = 0; s < 16; s++)
        E4[p][s] = E2[p << 1][s & 3] + E2[p << 1 | 1][s >> 2];
    }
    for (uint p = 0; p < 4; p++) {
      for (uint s = 0; s < 256; s++)
        E8[p][s] = E4[p << 1][s & 15] + E4[p << 1 | 1][s >> 4];
    }
    uint best_index = 0;
    for (uint best_error = cUINT32_MAX, s = 0; s < m_color_selectors.size(); s++) {
      uint32 selector = m_color_selectors[s];
      uint error = E8[0][selector & 255] + E8[1][selector >> 8 & 255] + E8[2][selector >> 16 & 255] + E8[3][selector >> 24 & 255];
      if (error < best_error) {
        best_error = error;
        best_index = s;
      }
    }
    uint (&total_errors)[16][4] = selector_details[best_index].error;
    for (uint p = 0; p < 16; p++) {
      for (uint s = 0; s < 4; s++)
        total_errors[p][s] += E2[p][s];
    }
    selector_details[best_index].used = true;
    m_selector_indices[m_has_subblocks ? b << 1 : b].color = best_index;
  }
}